

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

pattern * distItem(void)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  pattern *ppVar5;
  float fVar6;
  char msg [100];
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  char local_88 [112];
  
  bVar1 = false;
  ppVar5 = makeTerminal(0x13e,0);
  matchTok(0x194);
  if (lookahead == 0x191) {
    local_98 = (float)tokenval;
LAB_00125743:
    matchTok(lookahead);
    bVar1 = true;
  }
  else {
    local_98 = realtokval;
    if (lookahead == 0x192) goto LAB_00125743;
    local_98 = 0.0;
  }
  bVar3 = false;
  if ((bVar1) && (bVar3 = false, lookahead == 0x193)) {
    iVar4 = strcmp(SymTable[tokenval].lexptr,"OF");
    if (iVar4 == 0) {
      matchTok(0x193);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  local_94 = 1.0;
  if ((bVar3) && (lookahead == 0x2d)) {
    matchTok(0x2d);
    local_94 = -1.0;
  }
  if ((bool)(lookahead == 0x192 & bVar3)) {
    iVar4 = 0x192;
    fVar6 = realtokval;
LAB_00125812:
    local_94 = local_94 * fVar6;
    matchTok(iVar4);
    bVar2 = 1;
  }
  else {
    if ((bool)(bVar3 & lookahead == 0x191)) {
      iVar4 = 0x191;
      fVar6 = (float)tokenval;
      goto LAB_00125812;
    }
    local_94 = 0.0;
    bVar2 = 0;
  }
  bVar1 = (bool)(lookahead == 0x2c & bVar2);
  if (bVar1) {
    matchTok(0x2c);
  }
  if ((bool)(lookahead == 0x2d & bVar1)) {
    matchTok(0x2d);
    local_8c = -1.0;
  }
  else {
    local_8c = 1.0;
  }
  if ((bool)(lookahead == 0x192 & bVar1)) {
    iVar4 = 0x192;
    fVar6 = realtokval;
LAB_001258c1:
    local_8c = local_8c * fVar6;
    matchTok(iVar4);
    bVar2 = 1;
  }
  else {
    if ((bool)(bVar1 & lookahead == 0x191)) {
      iVar4 = 0x191;
      fVar6 = (float)tokenval;
      goto LAB_001258c1;
    }
    local_8c = 0.0;
    bVar2 = 0;
  }
  bVar1 = (bool)(lookahead == 0x2c & bVar2);
  if (bVar1) {
    matchTok(0x2c);
  }
  if ((bool)(lookahead == 0x2d & bVar1)) {
    matchTok(0x2d);
    local_90 = -1.0;
  }
  else {
    local_90 = 1.0;
  }
  if ((bool)(lookahead == 0x192 & bVar1)) {
    iVar4 = 0x192;
    fVar6 = realtokval;
  }
  else {
    if (!(bool)(bVar1 & lookahead == 0x191)) {
      bVar1 = true;
      local_90 = 0.0;
      goto LAB_0012598e;
    }
    iVar4 = 0x191;
    fVar6 = (float)tokenval;
  }
  local_90 = local_90 * fVar6;
  matchTok(iVar4);
  bVar1 = false;
LAB_0012598e:
  if (bVar1) {
    describeLookahead(local_88,"syntax: parsing WITHIN: ");
    errmsg(local_88);
    ParseError = 1;
  }
  else {
    ppVar5->fvec[0] = local_98;
    ppVar5->fvec[1] = local_94;
    ppVar5->fvec[2] = local_8c;
    ppVar5->fvec[3] = local_90;
  }
  return ppVar5;
}

Assistant:

pattern* distItem() {
   pattern *f;
   float dst = 0.0, px = 0.0, py = 0.0, pz = 0.0, signFactor = 0.0;
   int ok = 1;

/* within */
   f = makeTerminal(DIST_NODE, 0);
   matchTok(WITHIN_TOK);
/* distance */
   if (ok && lookahead == REALNUM_TOK) {
      dst = realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      dst = tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* of */
   if (ok && lookahead == ID_TOK
          && strcmp(SymTable[tokenval].lexptr, "OF") == 0) {
      matchTok(ID_TOK);
   }
   else { ok = 0; }
/* x */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      px = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      px = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* y */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      py = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      py = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* z */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      pz = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      pz = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }

/* info is packed into the floating-point vector */
   if (ok) {
      f->fvec[0] = dst;
      f->fvec[1] = px;
      f->fvec[2] = py;
      f->fvec[3] = pz;
   }
   else {
      char msg[100];
      describeLookahead(msg,"syntax: parsing WITHIN: ");
      errmsg(msg);
      ParseError = TRUE;
   }
   return f;
}